

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  mixed_channel_t mVar1;
  float fVar2;
  float fVar3;
  float local_110;
  byte local_10b;
  byte local_10a;
  byte local_109;
  float local_108;
  mixed_channel_t c_2;
  mixed_channel_t c_1;
  mixed_channel_t c;
  float volume;
  float distance;
  float location [3];
  float roll;
  float max;
  float min;
  float forward [3];
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float local_a8 [2];
  float volumes [33];
  space_mixer_data *data_local;
  space_source *source_local;
  
  _max = 0;
  forward[0] = 1.0;
  fVar3 = source->min_distance;
  location[2] = source->max_distance;
  location[1] = source->rolloff;
  volume = source->location[0] - data->location[0];
  distance = source->location[1] - data->location[1];
  location[0] = source->location[2] - data->location[2];
  fVar2 = vec_length(&volume);
  if (location[2] <= fVar2) {
    local_110 = location[2];
  }
  else {
    local_110 = vec_length(&volume);
  }
  local_108 = 1.0;
  if ((fVar3 < local_110) && (fVar3 < location[2])) {
    local_108 = (*data->attenuation)(fVar3,location[2],local_110,location[1]);
    local_108 = local_108 * 1.0;
  }
  if ((source->spatial & 1U) == 0) {
    volume = 0.0;
    distance = 0.0;
    location[0] = 0.0;
    mixed_compute_gains_resolver(&volume,local_a8,forward + 2,(long)forward + 7,&data->vbap);
    for (local_10b = 0; local_10b < forward[1]._3_1_; local_10b = local_10b + 1) {
      if (local_108 * local_a8[local_10b] <= 1.0) {
        fVar3 = local_108 * local_a8[local_10b];
      }
      else {
        fVar3 = 1.0;
      }
      local_a8[local_10b] = fVar3;
    }
  }
  else {
    vec_mul(&volume,data->look_at,&volume);
    if (local_110 < fVar3) {
      if ((1.0 - local_110 / fVar3) * 2.0 <= 1.0) {
        fVar2 = (1.0 - local_110 / fVar3) * 2.0;
      }
      else {
        fVar2 = 1.0;
      }
      vec_lerp(&volume,&volume,&max,fVar2);
    }
    mixed_compute_gains_resolver(&volume,local_a8,forward + 2,(long)forward + 7,&data->vbap);
    for (local_109 = 0; local_109 < forward[1]._3_1_; local_109 = local_109 + 1) {
      if (local_108 * local_a8[local_109] <= 1.0) {
        fVar2 = local_108 * local_a8[local_109];
      }
      else {
        fVar2 = 1.0;
      }
      local_a8[local_109] = fVar2;
    }
    if ((((data->surround & 1U) == 0) && (fVar3 < local_110)) &&
       (fVar3 = calculate_phase(&volume), fVar3 < 0.0)) {
      for (local_10a = 0; local_10a < forward[1]._3_1_; local_10a = local_10a + 1) {
        mVar1 = (data->channels).positions[*(byte *)((long)forward + (ulong)local_10a + 8)];
        if ((((mVar1 == '\x01') || (mVar1 == '\t')) ||
            ((mVar1 == '\x11' || ((mVar1 == '\x19' || (mVar1 == '\x1d')))))) || (mVar1 == ' ')) {
          local_a8[local_10a] = local_a8[local_10a] * -1.0;
        }
      }
    }
  }
  memcpy(source->volumes,local_a8,(ulong)forward[1]._3_1_ << 2);
  memcpy(source->speakers,forward + 2,(ulong)forward[1]._3_1_ << 2);
  source->speaker_count = forward[1]._3_1_;
  return;
}

Assistant:

VECTORIZE static void calculate_volumes(struct space_source *source, struct space_mixer_data *data){
  float volumes[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speakers[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speaker_count;
  float forward[3] = {0.0, 0.0, 1.0};
  float min = source->min_distance;
  float max = source->max_distance;
  float roll = source->rolloff;
  // Relative location to our listener
  float location[3] = {source->location[0]-data->location[0],
                       source->location[1]-data->location[1],
                       source->location[2]-data->location[2]};
  float distance = MIN(vec_length(location), max);
  float volume = 1.0;
  if(min < distance && min < max){
    volume *= data->attenuation(min, max, distance, roll);
  }
  if(source->spatial){
    // Bring the location into our reference frame
    vec_mul(location, data->look_at, location);
    // If we are below min distance, bend towards forward
    if(distance < min){
      vec_lerp(location, location, forward, MIN(1.0, (1-distance/min)*2));
    }
    // Compute the actual gain factors using VBAP
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
    // If we are not on a surround setup, we can simulate the sound appearing
    // from behind by inverting the right channels, causing a phase shift.
    // Only do this when the sound is far enough away though as otherwise it
    // can lead to frequent fluctuations, which sound very... bad.
    if(!data->surround && min < distance && calculate_phase(location) < 0){
      for(mixed_channel_t c=0; c<speaker_count; ++c){
        switch(data->channels.positions[speakers[c]]){
        case MIXED_RIGHT_FRONT_BOTTOM:
        case MIXED_RIGHT_FRONT_TOP:
        case MIXED_RIGHT_FRONT_WIDE:
        case MIXED_RIGHT_FRONT_HIGH:
        case MIXED_RIGHT_CENTER_BOTTOM:
        case MIXED_RIGHT_FRONT_CENTER_BOTTOM:
          volumes[c] *= -1.0;
        }
      }
    }
  }else{
    location[0] = 0.0;
    location[1] = 0.0;
    location[2] = 0.0;
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
  }
  // Cache
  memcpy(source->volumes, volumes, sizeof(float)*speaker_count);
  memcpy(source->speakers, speakers, sizeof(float)*speaker_count);
  source->speaker_count = speaker_count;
}